

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

void __thiscall
vkt::api::anon_unknown_1::CreateThread<vkt::api::(anonymous_namespace)::Device>::runThread
          (CreateThread<vkt::api::(anonymous_namespace)::Device> *this)

{
  Parameters *in_RCX;
  uint uVar1;
  Move<vk::VkDevice_s_*> local_30;
  
  uVar1 = 0;
  do {
    if ((uVar1 & 3) == 0) {
      de::SpinBarrier::sync((this->super_ThreadGroupThread).m_barrier);
    }
    Device::create(&local_30,(Environment *)this->m_env->allocationCallbacks,this->m_resources,
                   in_RCX);
    if (local_30.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
      (*local_30.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
                (local_30.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                 local_30.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x14);
  return;
}

Assistant:

void runThread (void)
	{
		const int	numIters			= getCreateCount<Object>();
		const int	itersBetweenSyncs	= numIters / 5;

		DE_ASSERT(itersBetweenSyncs > 0);

		for (int iterNdx = 0; iterNdx < numIters; iterNdx++)
		{
			// Sync every Nth iteration to make entering driver at the same time more likely
			if ((iterNdx % itersBetweenSyncs) == 0)
				barrier();

			{
				Unique<typename Object::Type>	obj	(Object::create(m_env, m_resources, m_params));
			}
		}
	}